

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::startDocument(QXmlStreamReaderPrivate *this)

{
  int iVar1;
  QString *pQVar2;
  Attribute *pAVar3;
  bool bVar4;
  ushort uVar5;
  Data *pDVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *psVar14;
  long lVar15;
  ulong uVar16;
  char *__s;
  qsizetype qVar17;
  Interface *pIVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  QXmlUtils *this_00;
  long in_FS_OFFSET;
  QStringView encName;
  QAnyStringView name;
  QStringView rhs;
  QStringView rhs_00;
  QByteArrayView in;
  QStringView rhs_01;
  QStringView rhs_02;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QStringView rhs_03;
  QAnyStringView a_02;
  QStringView needle0;
  QLatin1StringView lhs;
  QStringView haystack0;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QLatin1StringView lhs_03;
  long local_100;
  QString local_d0;
  QString local_b8;
  QString local_98;
  undefined1 local_78 [8];
  char16_t *pcStack_70;
  storage_type_conflict *local_68;
  qsizetype qStack_60;
  anon_union_16_2_cfafc8b3_for_State_4 local_58;
  ClearDataFn local_48;
  long local_38;
  storage_type_conflict *extraout_RDX;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  pQVar2 = (this->documentVersion).m_string;
  if (pQVar2 == (QString *)0x0) {
    lVar21 = 0;
    pcVar9 = (char16_t *)0x0;
  }
  else {
    lVar21 = (this->documentVersion).m_size;
    if (lVar21 == 3) {
      pcVar9 = (pQVar2->d).ptr;
      if (pcVar9 == (char16_t *)0x0) {
        pcVar9 = &QString::_empty;
      }
      rhs.m_data = pcVar9 + (this->documentVersion).m_pos;
      rhs.m_size = 3;
      lhs.m_data = "1.0";
      lhs.m_size = 3;
      bVar8 = QtPrivate::equalStrings(lhs,rhs);
      if (bVar8) {
        pcVar9 = (char16_t *)0x0;
        goto LAB_0039069d;
      }
    }
    pcVar9 = (pQVar2->d).ptr;
    if (pcVar9 == (char16_t *)0x0) {
      pcVar9 = &QString::_empty;
    }
    pcVar9 = pcVar9 + (this->documentVersion).m_pos;
  }
  local_78._0_2_ = 0x20;
  needle0.m_data = (storage_type_conflict *)local_78;
  needle0.m_size = 1;
  haystack0.m_data = pcVar9;
  haystack0.m_size = lVar21;
  qVar17 = QtPrivate::findString(haystack0,0,needle0,CaseSensitive);
  if (qVar17 == -1) {
    QCoreApplication::translate
              ((QString *)local_78,"QXmlStream","Unsupported XML version.",(char *)0x0,-1);
  }
  else {
    QCoreApplication::translate
              ((QString *)local_78,"QXmlStream","Invalid XML version string.",(char *)0x0,-1);
  }
  local_98.d.d = (Data *)local_78;
  local_98.d.ptr = pcStack_70;
  local_98.d.size = (qsizetype)local_68;
  pcVar9 = pcStack_70;
LAB_0039069d:
  lVar21 = (this->attributeStack).tos;
  bVar8 = pcVar9 == (char16_t *)0x0;
  if (-1 < lVar21 && bVar8) {
    lVar20 = 0x28;
    local_100 = 0;
    do {
      pAVar3 = (this->attributeStack).data;
      uVar12 = (ulong)*(short *)((long)pAVar3 + lVar20 + -0x18);
      lVar15 = *(long *)((long)pAVar3 + lVar20 + -0x28) + uVar12;
      uVar16 = *(long *)((long)pAVar3 + lVar20 + -0x20) - uVar12;
      lVar13 = (long)*(short *)((long)&(pAVar3->key).pos + lVar20);
      lVar19 = *(long *)((long)pAVar3 + lVar20 + -0x10) + lVar13;
      this_00 = (QXmlUtils *)(*(long *)((long)pAVar3 + lVar20 + -8) - lVar13);
      if (uVar12 < 2) {
        if (uVar16 == 10) {
          pcVar9 = (this->textBuffer).d.ptr;
          if (pcVar9 == (char16_t *)0x0) {
            pcVar9 = &QString::_empty;
          }
          rhs_01.m_data = pcVar9 + lVar15;
          rhs_01.m_size = 10;
          lhs_01.m_data = "standalone";
          lhs_01.m_size = 10;
          bVar8 = QtPrivate::equalStrings(lhs_01,rhs_01);
          if (bVar8) {
            uVar5 = (ushort)*(undefined4 *)&this->field_0x3a8;
            *(ushort *)&this->field_0x3a8 = uVar5 | 0x2000;
            if (this_00 == (QXmlUtils *)0x2) {
              rhs_03.m_data = pcVar9 + lVar19;
              rhs_03.m_size = 2;
              lhs_03.m_data = "no";
              lhs_03.m_size = 2;
              bVar8 = QtPrivate::equalStrings(lhs_03,rhs_03);
              if (!bVar8) goto LAB_00390d40;
              *(ushort *)&this->field_0x3a8 = uVar5 & 0xfff7 | 0x2000;
            }
            else if ((this_00 == (QXmlUtils *)0x3) &&
                    (rhs_02.m_data = pcVar9 + lVar19, rhs_02.m_size = 3, lhs_02.m_data = "yes",
                    lhs_02.m_size = 3, bVar8 = QtPrivate::equalStrings(lhs_02,rhs_02), bVar8)) {
              *(ushort *)&this->field_0x3a8 = uVar5 | 0x2008;
            }
            else {
LAB_00390d40:
              QCoreApplication::translate
                        ((QString *)local_78,"QXmlStream","Standalone accepts only yes or no.",
                         (char *)0x0,-1);
              auVar7 = local_78;
              qVar17 = local_98.d.size;
              pDVar6 = local_98.d.d;
              local_78 = (undefined1  [8])local_98.d.d;
              local_98.d.d = (Data *)auVar7;
              local_98.d.ptr = pcStack_70;
              pcStack_70 = (char16_t *)0x0;
              local_98.d.size = (qsizetype)local_68;
              local_68 = (storage_type_conflict *)qVar17;
              if ((Interface *)pDVar6 != (Interface *)0x0) {
                LOCK();
                *(int *)&pDVar6->super_QArrayData = *(int *)&pDVar6->super_QArrayData + -1;
                UNLOCK();
                if (*(int *)&pDVar6->super_QArrayData == 0) {
                  QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                }
              }
            }
            goto LAB_00390c04;
          }
          goto LAB_00390ac1;
        }
        if (uVar16 != 8) goto LAB_00390ac1;
        pcVar9 = (this->textBuffer).d.ptr;
        pcVar10 = pcVar9;
        if (pcVar9 == (char16_t *)0x0) {
          pcVar10 = &QString::_empty;
        }
        rhs_00.m_data = pcVar10 + lVar15;
        rhs_00.m_size = 8;
        lhs_00.m_data = "encoding";
        lhs_00.m_size = 8;
        bVar8 = QtPrivate::equalStrings(lhs_00,rhs_00);
        if (!bVar8) goto LAB_00390ac1;
        (this->documentEncoding).m_string = &this->textBuffer;
        (this->documentEncoding).m_pos = lVar19;
        (this->documentEncoding).m_size = (qsizetype)this_00;
        psVar14 = extraout_RDX;
        if ((this->field_0x3a9 & 0x20) != 0) {
          QCoreApplication::translate
                    ((QString *)local_78,"QXmlStream",
                     "The standalone pseudo attribute must appear after the encoding.",(char *)0x0,
                     -1);
          psVar14 = local_68;
          auVar7 = local_78;
          qVar17 = local_98.d.size;
          pDVar6 = local_98.d.d;
          local_78 = (undefined1  [8])local_98.d.d;
          local_98.d.d = (Data *)auVar7;
          local_98.d.ptr = pcStack_70;
          pcStack_70 = (char16_t *)0x0;
          local_98.d.size = (qsizetype)local_68;
          local_68 = (storage_type_conflict *)qVar17;
          if ((Interface *)pDVar6 != (Interface *)0x0) {
            LOCK();
            *(int *)&pDVar6->super_QArrayData = *(int *)&pDVar6->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar6->super_QArrayData == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
              psVar14 = extraout_RDX_00;
            }
          }
          pcVar9 = (this->textBuffer).d.ptr;
        }
        if (pcVar9 == (char16_t *)0x0) {
          pcVar9 = &QString::_empty;
        }
        encName.m_data = psVar14;
        encName.m_size = (qsizetype)(pcVar9 + lVar19);
        bVar8 = QXmlUtils::isEncName(this_00,encName);
        if (!bVar8) {
          QCoreApplication::translate
                    (&local_b8,"QXmlStream","%1 is an invalid encoding name.",(char *)0x0,-1);
          pcVar9 = (this->textBuffer).d.ptr;
          if (pcVar9 == (char16_t *)0x0) {
            pcVar9 = &QString::_empty;
          }
          a_01.m_size = (ulong)this_00 | 0x8000000000000000;
          a_01.field_0.m_data_utf16 = pcVar9 + lVar19;
          QString::arg_impl((QString *)local_78,&local_b8,a_01,0,(QChar)0x20);
          psVar14 = local_68;
          auVar7 = local_78;
          pcVar9 = local_98.d.ptr;
          pDVar6 = local_98.d.d;
          local_78 = (undefined1  [8])local_98.d.d;
          local_98.d.d = (Data *)auVar7;
          local_98.d.ptr = pcStack_70;
          pcStack_70 = pcVar9;
          local_68 = (storage_type_conflict *)local_98.d.size;
          local_98.d.size = (qsizetype)psVar14;
          if ((Interface *)pDVar6 != (Interface *)0x0) {
            LOCK();
            *(int *)&pDVar6->super_QArrayData = *(int *)&pDVar6->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar6->super_QArrayData == 0) {
              QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
            }
          }
          if ((Interface *)local_b8.d.d == (Interface *)0x0) goto LAB_00390c04;
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pIVar18 = (Interface *)local_b8.d.d;
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
          goto LAB_00390c04;
          goto LAB_00390bf5;
        }
        local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pcVar9 = (this->textBuffer).d.ptr;
        if (pcVar9 == (char16_t *)0x0) {
          pcVar9 = &QString::_empty;
        }
        QString::QString((QString *)local_78,(QChar *)(pcVar9 + lVar19),(qsizetype)this_00);
        QString::toUtf8_helper((QByteArray *)&local_b8,(QString *)local_78);
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)(char **)local_78 = *(int *)(char **)local_78 + -1;
          UNLOCK();
          if (*(int *)(char **)local_78 == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if ((this->field_0x3a9 & 8) == 0) {
          __s = (char *)local_b8.d.ptr;
          if (local_b8.d.ptr == (char16_t *)0x0) {
            __s = &QByteArray::_empty;
          }
          sVar11 = strlen(__s);
          name.m_size = sVar11;
          name.field_0.m_data_utf8 = __s;
          QStringConverter::QStringConverter((QStringConverter *)local_78,name,(Flags)0x0);
          (this->decoder).super_QStringConverter.iface = (Interface *)local_78;
          QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
          (this->decoder).super_QStringConverter.state.flags.
          super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
          super_QFlagsStorage<QStringConverterBase::Flag>.i = (Int)pcStack_70._0_4_;
          (this->decoder).super_QStringConverter.state.remainingChars = (qsizetype)local_68;
          (this->decoder).super_QStringConverter.state.invalidChars = qStack_60;
          (this->decoder).super_QStringConverter.state.field_4.d[0] = local_58.d[0];
          (this->decoder).super_QStringConverter.state.field_4.d[1] = local_58.d[1];
          (this->decoder).super_QStringConverter.state.clearFn = local_48;
          local_48 = (ClearDataFn)0x0;
          QStringConverterBase::State::clear((State *)&pcStack_70);
          if ((this->decoder).super_QStringConverter.iface == (Interface *)0x0) {
            QCoreApplication::translate
                      (&local_d0,"QXmlStream","Encoding %1 is unsupported",(char *)0x0,-1);
            pcVar9 = (this->textBuffer).d.ptr;
            if (pcVar9 == (char16_t *)0x0) {
              pcVar9 = &QString::_empty;
            }
            a_02.m_size = (ulong)this_00 | 0x8000000000000000;
            a_02.field_0.m_data_utf16 = pcVar9 + lVar19;
            QString::arg_impl((QString *)local_78,&local_d0,a_02,0,(QChar)0x20);
            psVar14 = local_68;
            auVar7 = local_78;
            pcVar9 = local_98.d.ptr;
            pDVar6 = local_98.d.d;
            local_78 = (undefined1  [8])local_98.d.d;
            local_98.d.d = (Data *)auVar7;
            local_98.d.ptr = pcStack_70;
            pcStack_70 = pcVar9;
            local_68 = (storage_type_conflict *)local_98.d.size;
            local_98.d.size = (qsizetype)psVar14;
            if ((Interface *)pDVar6 != (Interface *)0x0) {
              LOCK();
              *(int *)&pDVar6->super_QArrayData = *(int *)&pDVar6->super_QArrayData + -1;
              UNLOCK();
              if (*(int *)&pDVar6->super_QArrayData == 0) {
                QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
              }
            }
            if ((Interface *)local_d0.d.d != (Interface *)0x0) {
              LOCK();
              ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              iVar1 = ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              ;
              UNLOCK();
              pIVar18 = (Interface *)local_d0.d.d;
              goto joined_r0x00390e9a;
            }
          }
          else {
            in.m_data = (this->rawReadBuffer).d.ptr;
            in.m_size = this->nbytesread;
            QStringDecoder::decodeAsString((QString *)local_78,&this->decoder,in);
            pIVar18 = (Interface *)(this->readBuffer).d.d;
            pcVar9 = (this->readBuffer).d.ptr;
            (this->readBuffer).d.d = (Data *)local_78;
            (this->readBuffer).d.ptr = pcStack_70;
            psVar14 = (storage_type_conflict *)(this->readBuffer).d.size;
            (this->readBuffer).d.size = (qsizetype)local_68;
            local_78 = (undefined1  [8])pIVar18;
            pcStack_70 = pcVar9;
            local_68 = psVar14;
            if (pIVar18 != (Interface *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&pIVar18->name)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&pIVar18->name)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              iVar1 = (((QBasicAtomicInt *)&pIVar18->name)->_q_value).super___atomic_base<int>._M_i;
              UNLOCK();
joined_r0x00390e9a:
              if (iVar1 == 0) {
                QArrayData::deallocate((QArrayData *)pIVar18,2,0x10);
              }
            }
          }
        }
        if ((Interface *)local_b8.d.d == (Interface *)0x0) goto LAB_00390c04;
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
        goto LAB_00390c04;
        qVar17 = 1;
        pIVar18 = (Interface *)local_b8.d.d;
LAB_00390bfa:
        QArrayData::deallocate((QArrayData *)pIVar18,qVar17,0x10);
      }
      else {
LAB_00390ac1:
        QCoreApplication::translate
                  (&local_d0,"QXmlStream","Invalid attribute in XML declaration: %1 = %2",
                   (char *)0x0,-1);
        pcVar9 = (this->textBuffer).d.ptr;
        if (pcVar9 == (char16_t *)0x0) {
          pcVar9 = &QString::_empty;
        }
        a.m_size = uVar16 | 0x8000000000000000;
        a.field_0.m_data_utf16 = pcVar9 + lVar15;
        QString::arg_impl(&local_b8,&local_d0,a,0,(QChar)0x20);
        pcVar9 = (this->textBuffer).d.ptr;
        if (pcVar9 == (char16_t *)0x0) {
          pcVar9 = &QString::_empty;
        }
        a_00.m_size = (ulong)this_00 | 0x8000000000000000;
        a_00.field_0.m_data_utf16 = pcVar9 + lVar19;
        QString::arg_impl((QString *)local_78,&local_b8,a_00,0,(QChar)0x20);
        psVar14 = local_68;
        auVar7 = local_78;
        pcVar9 = local_98.d.ptr;
        pDVar6 = local_98.d.d;
        local_78 = (undefined1  [8])local_98.d.d;
        local_98.d.d = (Data *)auVar7;
        local_98.d.ptr = pcStack_70;
        pcStack_70 = pcVar9;
        local_68 = (storage_type_conflict *)local_98.d.size;
        local_98.d.size = (qsizetype)psVar14;
        if ((Interface *)pDVar6 != (Interface *)0x0) {
          LOCK();
          *(int *)&pDVar6->super_QArrayData = *(int *)&pDVar6->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&pDVar6->super_QArrayData == 0) {
            QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
          }
        }
        if ((Interface *)local_b8.d.d != (Interface *)0x0) {
          LOCK();
          *(int *)&(local_b8.d.d)->super_QArrayData = *(int *)&(local_b8.d.d)->super_QArrayData + -1
          ;
          UNLOCK();
          if (*(int *)&(local_b8.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((Interface *)local_d0.d.d != (Interface *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pIVar18 = (Interface *)local_d0.d.d;
          if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00390bf5:
            qVar17 = 2;
            goto LAB_00390bfa;
          }
        }
      }
LAB_00390c04:
      bVar8 = local_98.d.ptr == (char16_t *)0x0;
      if (!bVar8) break;
      lVar20 = lVar20 + 0x30;
      bVar4 = local_100 < lVar21;
      local_100 = local_100 + 1;
    } while (bVar4);
  }
  if (!bVar8) {
    this->error = NotWellFormedError;
    QString::operator=(&this->errorString,&local_98);
    this->type = Invalid;
  }
  (this->attributeStack).tos = -1;
  if ((Interface *)local_98.d.d != (Interface *)0x0) {
    LOCK();
    *(int *)&(local_98.d.d)->super_QArrayData = *(int *)&(local_98.d.d)->super_QArrayData + -1;
    UNLOCK();
    if (*(int *)&(local_98.d.d)->super_QArrayData == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::startDocument()
{
    QString err;
    if (documentVersion != "1.0"_L1) {
        if (documentVersion.view().contains(u' '))
            err = QXmlStream::tr("Invalid XML version string.");
        else
            err = QXmlStream::tr("Unsupported XML version.");
    }
    qsizetype n = attributeStack.size();

    /* We use this bool to ensure that the pesudo attributes are in the
     * proper order:
     *
     * [23]     XMLDecl     ::=     '<?xml' VersionInfo EncodingDecl? SDDecl? S? '?>' */

    for (qsizetype i = 0; err.isNull() && i < n; ++i) {
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef key(symString(attrib.key));
        XmlStringRef value(symString(attrib.value));

        if (prefix.isEmpty() && key == "encoding"_L1) {
            documentEncoding = value;

            if (hasStandalone)
                err = QXmlStream::tr("The standalone pseudo attribute must appear after the encoding.");
            if (!QXmlUtils::isEncName(value))
                err = QXmlStream::tr("%1 is an invalid encoding name.").arg(value);
            else {
                QByteArray enc = value.toString().toUtf8();
                if (!lockEncoding) {
                    decoder = QStringDecoder(enc.constData());
                    if (!decoder.isValid()) {
                        err = QXmlStream::tr("Encoding %1 is unsupported").arg(value);
                    } else {
                        readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));
                    }
                }
            }
        } else if (prefix.isEmpty() && key == "standalone"_L1) {
            hasStandalone = true;
            if (value == "yes"_L1)
                standalone = true;
            else if (value == "no"_L1)
                standalone = false;
            else
                err = QXmlStream::tr("Standalone accepts only yes or no.");
        } else {
            err = QXmlStream::tr("Invalid attribute in XML declaration: %1 = %2").arg(key).arg(value);
        }
    }

    if (!err.isNull())
        raiseWellFormedError(err);
    attributeStack.clear();
}